

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O3

void duckdb::Node::TransformToDeprecated
               (ART *art,Node *node,
               unsafe_unique_ptr<FixedSizeAllocator> *deprecated_prefix_allocator)

{
  idx_t iVar1;
  _Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false> _Var2;
  NType value;
  bool bVar3;
  type paVar4;
  iterator iVar5;
  pointer pFVar6;
  data_ptr_t pdVar7;
  InternalException *this;
  uint uVar8;
  Node *node_00;
  long lVar9;
  long lVar10;
  idx_t i;
  ulong uVar11;
  Node *pNVar12;
  byte *pbVar13;
  string local_70;
  string local_50;
  
  uVar11 = (node->super_IndexPointer).data;
  if (-1 < (long)uVar11) {
    value = (NType)(uVar11 >> 0x38);
    uVar8 = (uint)(uVar11 >> 0x20);
    switch(value) {
    case PREFIX:
      Prefix::TransformToDeprecated(art,node,deprecated_prefix_allocator);
      return;
    case LEAF:
    case LEAF_INLINED:
      break;
    case NODE_4:
      paVar4 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
               ::operator*(&art->allocators);
      _Var2._M_head_impl =
           paVar4->_M_elems[2].
           super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
           .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
      local_70._M_dataplus._M_p = (pointer)(uVar11 & 0xffffffff);
      iVar5 = ::std::
              _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&((_Var2._M_head_impl)->buffers)._M_h,(key_type *)&local_70);
      pFVar6 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
               ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                             *)((long)iVar5.
                                      super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_false>
                                      ._M_cur + 0x10));
      bVar3 = BufferHandle::IsValid(&pFVar6->buffer_handle);
      if (bVar3) {
        pFVar6 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                 ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                               *)((long)iVar5.
                                        super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_false>
                                        ._M_cur + 0x10));
        pdVar7 = FixedSizeBuffer::Get(pFVar6,true);
        if ((pdVar7 != (data_ptr_t)0x0) &&
           (pNVar12 = (Node *)(pdVar7 + (_Var2._M_head_impl)->bitmask_offset +
                                        (ulong)(uVar8 & 0xffffff) *
                                        (_Var2._M_head_impl)->segment_size),
           (data_t)(pNVar12->super_IndexPointer).data != '\0')) {
          uVar11 = 0;
          node_00 = pNVar12;
          do {
            node_00 = node_00 + 1;
            TransformToDeprecated(art,node_00,deprecated_prefix_allocator);
            uVar11 = uVar11 + 1;
          } while (uVar11 < (byte)(pNVar12->super_IndexPointer).data);
        }
      }
      break;
    case NODE_16:
      paVar4 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
               ::operator*(&art->allocators);
      _Var2._M_head_impl =
           paVar4->_M_elems[3].
           super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
           .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
      local_70._M_dataplus._M_p = (pointer)(uVar11 & 0xffffffff);
      iVar5 = ::std::
              _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&((_Var2._M_head_impl)->buffers)._M_h,(key_type *)&local_70);
      pFVar6 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
               ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                             *)((long)iVar5.
                                      super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_false>
                                      ._M_cur + 0x10));
      bVar3 = BufferHandle::IsValid(&pFVar6->buffer_handle);
      if (bVar3) {
        pFVar6 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                 ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                               *)((long)iVar5.
                                        super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_false>
                                        ._M_cur + 0x10));
        pdVar7 = FixedSizeBuffer::Get(pFVar6,true);
        if ((pdVar7 != (data_ptr_t)0x0) &&
           (pbVar13 = pdVar7 + (_Var2._M_head_impl)->bitmask_offset +
                               (ulong)(uVar8 & 0xffffff) * (_Var2._M_head_impl)->segment_size,
           *pbVar13 != 0)) {
          pNVar12 = (Node *)(pbVar13 + 0x18);
          uVar11 = 0;
          do {
            TransformToDeprecated(art,pNVar12,deprecated_prefix_allocator);
            uVar11 = uVar11 + 1;
            pNVar12 = pNVar12 + 1;
          } while (uVar11 < *pbVar13);
        }
      }
      break;
    case NODE_48:
      paVar4 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
               ::operator*(&art->allocators);
      _Var2._M_head_impl =
           paVar4->_M_elems[4].
           super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
           .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
      local_70._M_dataplus._M_p = (pointer)(uVar11 & 0xffffffff);
      iVar5 = ::std::
              _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&((_Var2._M_head_impl)->buffers)._M_h,(key_type *)&local_70);
      pFVar6 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
               ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                             *)((long)iVar5.
                                      super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_false>
                                      ._M_cur + 0x10));
      bVar3 = BufferHandle::IsValid(&pFVar6->buffer_handle);
      if (bVar3) {
        pFVar6 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                 ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                               *)((long)iVar5.
                                        super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_false>
                                        ._M_cur + 0x10));
        pdVar7 = FixedSizeBuffer::Get(pFVar6,true);
        if (pdVar7 != (data_ptr_t)0x0) {
          lVar9 = (ulong)(uVar8 & 0xffffff) * (_Var2._M_head_impl)->segment_size;
          iVar1 = (_Var2._M_head_impl)->bitmask_offset;
          lVar10 = 0;
          do {
            if ((ulong)pdVar7[lVar10 + iVar1 + lVar9 + 1] != 0x30) {
              TransformToDeprecated
                        (art,(Node *)(pdVar7 + (ulong)pdVar7[lVar10 + iVar1 + lVar9 + 1] * 8 +
                                               iVar1 + lVar9 + 0x108),deprecated_prefix_allocator);
            }
            lVar10 = lVar10 + 1;
          } while (lVar10 != 0x100);
        }
      }
      break;
    case NODE_256:
      paVar4 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
               ::operator*(&art->allocators);
      _Var2._M_head_impl =
           paVar4->_M_elems[5].
           super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
           .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
      local_70._M_dataplus._M_p = (pointer)(uVar11 & 0xffffffff);
      iVar5 = ::std::
              _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&((_Var2._M_head_impl)->buffers)._M_h,(key_type *)&local_70);
      pFVar6 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
               ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                             *)((long)iVar5.
                                      super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_false>
                                      ._M_cur + 0x10));
      bVar3 = BufferHandle::IsValid(&pFVar6->buffer_handle);
      if (bVar3) {
        pFVar6 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                 ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                               *)((long)iVar5.
                                        super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_false>
                                        ._M_cur + 0x10));
        pdVar7 = FixedSizeBuffer::Get(pFVar6,true);
        if (pdVar7 != (data_ptr_t)0x0) {
          lVar9 = (_Var2._M_head_impl)->bitmask_offset +
                  (ulong)(uVar8 & 0xffffff) * (_Var2._M_head_impl)->segment_size;
          lVar10 = 0;
          do {
            if (pdVar7[lVar10 + lVar9 + 0xf] != '\0') {
              TransformToDeprecated
                        (art,(Node *)(pdVar7 + lVar10 + lVar9 + 8),deprecated_prefix_allocator);
            }
            lVar10 = lVar10 + 8;
          } while (lVar10 != 0x800);
        }
      }
      break;
    default:
      this = (InternalException *)__cxa_allocate_exception(0x10);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,"invalid node type for TransformToDeprecated: %s","");
      EnumUtil::ToString<duckdb::NType>(&local_50,value);
      InternalException::InternalException<std::__cxx11::string>(this,&local_70,&local_50);
      __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    return;
  }
  Leaf::TransformToDeprecated(art,node);
  return;
}

Assistant:

void Node::TransformToDeprecated(ART &art, Node &node,
                                 unsafe_unique_ptr<FixedSizeAllocator> &deprecated_prefix_allocator) {
	D_ASSERT(node.HasMetadata());

	if (node.GetGateStatus() == GateStatus::GATE_SET) {
		D_ASSERT(node.GetType() != NType::LEAF_INLINED);
		return Leaf::TransformToDeprecated(art, node);
	}

	auto type = node.GetType();
	switch (type) {
	case NType::PREFIX:
		return Prefix::TransformToDeprecated(art, node, deprecated_prefix_allocator);
	case NType::LEAF_INLINED:
		return;
	case NType::LEAF:
		return;
	case NType::NODE_4:
		return TransformToDeprecatedInternal(art, InMemoryRef<Node4>(art, node, type), deprecated_prefix_allocator);
	case NType::NODE_16:
		return TransformToDeprecatedInternal(art, InMemoryRef<Node16>(art, node, type), deprecated_prefix_allocator);
	case NType::NODE_48:
		return TransformToDeprecatedInternal(art, InMemoryRef<Node48>(art, node, type), deprecated_prefix_allocator);
	case NType::NODE_256:
		return TransformToDeprecatedInternal(art, InMemoryRef<Node256>(art, node, type), deprecated_prefix_allocator);
	default:
		throw InternalException("invalid node type for TransformToDeprecated: %s", EnumUtil::ToString(type));
	}
}